

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

ICameraSceneNode * __thiscall
irr::scene::CSceneManager::addCameraSceneNode
          (CSceneManager *this,ISceneNode *parent,vector3df *position,vector3df *lookat,s32 id,
          bool makeActive)

{
  ICameraSceneNode *pIVar1;
  long *in_RDI;
  byte in_R9B;
  ICameraSceneNode *node;
  s32 in_stack_0000004c;
  ISceneManager *in_stack_00000050;
  ISceneNode *in_stack_00000058;
  CCameraSceneNode *in_stack_00000060;
  IReferenceCounted *in_stack_ffffffffffffffb8;
  
  pIVar1 = (ICameraSceneNode *)operator_new(0x2a0);
  CCameraSceneNode::CCameraSceneNode
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c,
             (vector3df *)this,(vector3df *)parent);
  if ((in_R9B & 1) != 0) {
    (**(code **)(*in_RDI + 0x78))(in_RDI,pIVar1);
  }
  IReferenceCounted::drop(in_stack_ffffffffffffffb8);
  return pIVar1;
}

Assistant:

ICameraSceneNode *CSceneManager::addCameraSceneNode(ISceneNode *parent,
		const core::vector3df &position, const core::vector3df &lookat, s32 id,
		bool makeActive)
{
	if (!parent)
		parent = this;

	ICameraSceneNode *node = new CCameraSceneNode(parent, this, id, position, lookat);

	if (makeActive)
		setActiveCamera(node);
	node->drop();

	return node;
}